

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# counter.h
# Opt level: O1

void duckdb_je_stats_interval_event_handler(tsd_t *tsd,uint64_t elapsed)

{
  ulong uVar1;
  atomic_u64_t aVar2;
  atomic_u64_t aVar3;
  bool bVar4;
  
  aVar2 = stats_interval_accumulated.accumbytes.val.repr;
  do {
    uVar1 = aVar2.repr + elapsed;
    aVar3.repr = uVar1;
    if (stats_interval_accumulated.interval <= uVar1) {
      aVar3.repr = uVar1 % stats_interval_accumulated.interval;
    }
    LOCK();
    bVar4 = (atomic_u64_t)aVar2.repr != stats_interval_accumulated.accumbytes.val.repr;
    if (bVar4) {
      aVar2 = stats_interval_accumulated.accumbytes.val.repr;
      aVar3 = stats_interval_accumulated.accumbytes.val.repr;
    }
    stats_interval_accumulated.accumbytes.val.repr = (atomic_u64_t)(atomic_u64_t)aVar3.repr;
    UNLOCK();
  } while (bVar4);
  if (stats_interval_accumulated.interval <= uVar1) {
    duckdb_je_malloc_stats_print((write_cb_t *)0x0,(void *)0x0,duckdb_je_opt_stats_interval_opts);
    return;
  }
  return;
}

Assistant:

JEMALLOC_ALWAYS_INLINE bool
counter_accum(tsdn_t *tsdn, counter_accum_t *counter, uint64_t bytes) {
	uint64_t interval = counter->interval;
	assert(interval > 0);
	LOCKEDINT_MTX_LOCK(tsdn, counter->mtx);
	/*
	 * If the event moves fast enough (and/or if the event handling is slow
	 * enough), extreme overflow can cause counter trigger coalescing.
	 * This is an intentional mechanism that avoids rate-limiting
	 * allocation.
	 */
	bool overflow = locked_inc_mod_u64(tsdn, LOCKEDINT_MTX(counter->mtx),
	    &counter->accumbytes, bytes, interval);
	LOCKEDINT_MTX_UNLOCK(tsdn, counter->mtx);
	return overflow;
}